

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(short lhs,
         SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  char cVar2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_SIL;
  short in_DI;
  short *unaff_retaddr;
  short ret;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff4;
  undefined1 in_stack_fffffffffffffff5;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff6;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffff8;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar5;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffffb;
  char cVar6;
  char in_stack_ffffffffffffffff;
  
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffffb);
  SVar5.m_int = in_SIL.m_int;
  bVar1 = DivisionCornerCaseHelper<char,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_DI,in_SIL,
                     (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffffb);
  if ((!bVar1) &&
     (cVar6 = SVar5.m_int,
     bVar1 = DivisionCornerCaseHelper2<char,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
             ::DivisionCornerCase2
                       (CONCAT11(in_stack_fffffffffffffff5,in_stack_fffffffffffffff4),
                        in_stack_fffffffffffffff6,in_stack_ffffffffffffffe8), !bVar1)) {
    uVar3 = 0;
    uVar4 = 0;
    cVar2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)(ulong)CONCAT15(in_stack_fffffffffffffff5,
                                          CONCAT14(in_stack_fffffffffffffff4,
                                                   in_stack_fffffffffffffff0)));
    DivisionHelper<short,char,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (unaff_retaddr,
               (char *)CONCAT17(in_stack_ffffffffffffffff,
                                CONCAT16(cVar6,CONCAT24(in_DI,CONCAT13(in_stack_fffffffffffffffb.
                                                                       m_int,CONCAT12(in_SIL.m_int,
                                                                                      CONCAT11(SVar5
                                                  .m_int,in_stack_fffffffffffffff8)))))),
               (short *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(cVar2,CONCAT14(
                                                  in_stack_fffffffffffffff4,
                                                  in_stack_fffffffffffffff0)))));
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<short>((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(cVar2,CONCAT14(
                                                  in_stack_fffffffffffffff4,
                                                  in_stack_fffffffffffffff0)))),
                   (short *)in_stack_ffffffffffffffe8);
    in_stack_fffffffffffffffb.m_int = in_stack_ffffffffffffffff;
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         in_stack_fffffffffffffffb.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}